

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O0

bool anon_unknown.dwarf_3cf3c::EndsWith(string *input,string *needle)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  __type local_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *needle_local;
  string *input_local;
  
  local_20 = needle;
  needle_local = input;
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  psVar1 = needle_local;
  local_42 = false;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_40,(ulong)psVar1);
    local_42 = std::operator==(&local_40,local_20);
  }
  input_local._7_1_ = local_42;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool EndsWith(const string& input, const string& needle) {
  return (input.size() >= needle.size() &&
          input.substr(input.size() - needle.size()) == needle);
}